

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProperties.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderPropertiesDefaultContextWideValues::iterate
          (TessellationShaderPropertiesDefaultContextWideValues *this)

{
  GLenum GVar1;
  bool bVar2;
  int iVar3;
  ContextType type;
  GLfloat GVar4;
  deUint32 dVar5;
  NotSupportedError *this_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  TestError *pTVar10;
  float fVar11;
  MessageBuilder local_558;
  MessageBuilder local_3d8;
  MessageBuilder local_258;
  GLint local_d8;
  GLint local_d4;
  GLint expected_int_value [4];
  GLboolean expected_bool_value [4];
  GLint expected_value;
  GLint n_components;
  GLenum pname;
  GLint int_value [4];
  GLfloat float_value [4];
  GLboolean bool_value [4];
  uint n_property;
  GLenum local_88;
  uint n_properties;
  GLint property_value_data [9];
  Functions *gl;
  float epsilon;
  allocator<char> local_31;
  string local_30;
  TessellationShaderPropertiesDefaultContextWideValues *local_10;
  TessellationShaderPropertiesDefaultContextWideValues *this_local;
  long lVar7;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  local_88 = (this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES;
  n_properties = 1;
  property_value_data[0] = 3;
  property_value_data[1] = 0x8e74;
  property_value_data[2] = 4;
  property_value_data[3] = 1;
  property_value_data[4] = 0x8e73;
  property_value_data[5] = 2;
  property_value_data[6] = 1;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  bVar2 = glu::isContextTypeES(type);
  GVar4 = 4.2039e-45;
  if (bVar2) {
    GVar4 = 1.4013e-45;
  }
  float_value[3] = 0.0;
  while( true ) {
    if ((uint)GVar4 <= (uint)float_value[3]) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    memset(float_value + 2,0,4);
    memset(int_value + 2,0,0x10);
    memset(&n_components,0,0x10);
    expected_value = (&local_88)[(uint)((int)float_value[3] * 3)];
    GVar1 = (&local_88)[(int)float_value[3] * 3 + 1];
    expected_int_value[3] = (&local_88)[(int)float_value[3] * 3 + 2];
    (**(code **)(lVar7 + 0x798))(expected_value,float_value + 2);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetBooleanv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x58);
    (**(code **)(lVar7 + 0x818))(expected_value,int_value + 2);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetFloatv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x5b);
    (**(code **)(lVar7 + 0x868))(expected_value,&n_components);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0x5e);
    expected_int_value[2]._0_1_ = expected_int_value[3] != 0;
    expected_int_value[2]._1_1_ = expected_int_value[3] != 0;
    expected_int_value[2]._2_1_ = expected_int_value[3] != 0;
    expected_int_value[2]._3_1_ = expected_int_value[3] != 0;
    local_d8 = expected_int_value[3];
    local_d4 = expected_int_value[3];
    expected_int_value[0] = expected_int_value[3];
    expected_int_value[1] = expected_int_value[3];
    iVar3 = memcmp(expected_int_value + 2,float_value + 2,(long)(int)GVar1);
    if (iVar3 != 0) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_258,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_258,(char (*) [34])"glGetBooleanv() called for pname ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(uint *)&expected_value);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [25])" reported invalid value.");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_258);
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"Invalid value reported by glGetBooleanv()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x6e);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    iVar3 = memcmp(&local_d8,&n_components,(long)(int)GVar1 << 2);
    if (iVar3 != 0) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3d8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_3d8,(char (*) [34])"glGetIntegerv() called for pname ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(uint *)&expected_value);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [25])" reported invalid value.");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3d8);
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar10,"Invalid value reported by glGetIntegerv()",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x76);
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (((((0 < (int)GVar1) &&
          (fVar11 = de::abs<float>((float)int_value[2] - (float)expected_int_value[3]),
          1e-05 < fVar11)) ||
         ((1 < (int)GVar1 &&
          (fVar11 = de::abs<float>((float)int_value[3] - (float)expected_int_value[3]),
          1e-05 < fVar11)))) ||
        ((2 < (int)GVar1 &&
         (fVar11 = de::abs<float>(float_value[0] - (float)expected_int_value[3]), 1e-05 < fVar11))))
       || ((3 < (int)GVar1 &&
           (fVar11 = de::abs<float>(float_value[1] - (float)expected_int_value[3]), 1e-05 < fVar11))
          )) break;
    float_value[3] = (GLfloat)((int)float_value[3] + 1);
  }
  pTVar8 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_558,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     (&local_558,(char (*) [32])"glGetFloatv() called for pname ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(uint *)&expected_value);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [25])" reported invalid value.");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_558);
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar10,"Invalid value reported by glGetFloatv()",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
             ,0x81);
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderPropertiesDefaultContextWideValues::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Iterate through all context-wide properties and compare expected values
	 * against the reference ones
	 */
	const float			  epsilon = (float)1e-5;
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();

	const glw::GLint property_value_data[] = { /* pname */ /* n components */ /* default value */
											   static_cast<glw::GLint>(m_glExtTokens.PATCH_VERTICES), 1, 3,
											   /* The following values are only applicable to Desktop OpenGL. */
											   GL_PATCH_DEFAULT_OUTER_LEVEL, 4, 1, GL_PATCH_DEFAULT_INNER_LEVEL, 2, 1 };

	const unsigned int n_properties = (glu::isContextTypeES(m_context.getRenderContext().getType())) ? 1 : 3;

	for (unsigned int n_property = 0; n_property < n_properties; ++n_property)
	{
		glw::GLboolean bool_value[4]  = { GL_FALSE };
		glw::GLfloat   float_value[4] = { 0.0f };
		glw::GLint	 int_value[4]   = { 0 };

		glw::GLenum pname		   = property_value_data[n_property * 3 + 0];
		glw::GLint  n_components   = property_value_data[n_property * 3 + 1];
		glw::GLint  expected_value = property_value_data[n_property * 3 + 2];

		/* Call all relevant getters */
		gl.getBooleanv(pname, bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() failed.");

		gl.getFloatv(pname, float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() failed.");

		gl.getIntegerv(pname, int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed.");

		/* Compare retrieved vector value components against expected value */
		glw::GLboolean expected_bool_value[4] = {
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE,
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE,
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE,
			(expected_value != 0) ? (glw::GLboolean)GL_TRUE : (glw::GLboolean)GL_FALSE
		};
		glw::GLint expected_int_value[4] = { expected_value, expected_value, expected_value, expected_value };

		if (memcmp(expected_bool_value, bool_value, sizeof(bool) * n_components) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glGetBooleanv() called for pname " << pname
							   << " reported invalid value." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by glGetBooleanv()");
		}

		if (memcmp(expected_int_value, int_value, sizeof(int) * n_components) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() called for pname " << pname
							   << " reported invalid value." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by glGetIntegerv()");
		}

		if ((n_components >= 1 && de::abs(float_value[0] - (float)expected_value) > epsilon) ||
			(n_components >= 2 && de::abs(float_value[1] - (float)expected_value) > epsilon) ||
			(n_components >= 3 && de::abs(float_value[2] - (float)expected_value) > epsilon) ||
			(n_components >= 4 && de::abs(float_value[3] - (float)expected_value) > epsilon))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glGetFloatv() called for pname " << pname
							   << " reported invalid value." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid value reported by glGetFloatv()");
		}
	} /* for (all properties) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}